

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
LPFreadValue<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,char **pos,SPxOut *spxout)

{
  double dVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  bool bVar8;
  char *pcVar9;
  byte *pbVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  char tmp [8192];
  int local_2038 [2050];
  
  pcVar9 = *(char **)this;
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x1c;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x11] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x12] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x13] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x14] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x15] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x16] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x17] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x18] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x19] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1a] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x6d) = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)__return_storage_ptr__,1.0);
  if ((*pcVar9 == '-') || (*pcVar9 == '+')) {
    pcVar9 = pcVar9 + 1;
  }
  pbVar10 = (byte *)(pcVar9 + -1);
  bVar3 = false;
  do {
    bVar8 = bVar3;
    pbVar6 = pbVar10 + 1;
    pbVar10 = pbVar10 + 1;
    bVar3 = true;
  } while ((byte)(*pbVar6 - 0x30) < 10);
  bVar3 = bVar8;
  if (*pbVar6 == 0x2e) {
    do {
      bVar8 = bVar3;
      pbVar6 = pbVar10 + 1;
      pbVar10 = pbVar10 + 1;
      bVar3 = true;
    } while ((byte)(*pbVar6 - 0x30) < 10);
  }
  iVar5 = tolower((int)(char)*pbVar10);
  if (iVar5 == 0x65) {
    if ((pbVar10[1] == 0x2d) || (pbVar10[1] == 0x2b)) {
      pbVar10 = pbVar10 + 2;
    }
    else {
      pbVar10 = pbVar10 + 1;
    }
    pbVar10 = pbVar10 + -1;
    bVar2 = 1;
    do {
      bVar4 = bVar2;
      pbVar6 = pbVar10 + 1;
      pbVar10 = pbVar10 + 1;
      bVar2 = 0;
    } while ((byte)(*pbVar6 - 0x30) < 10);
  }
  else {
    bVar4 = 0;
  }
  if ((!(bool)(~bVar4 & 1) && pos != (char **)0x0) && (0 < *(int *)(pos + 1))) {
    local_2038[0] = *(int *)(pos + 1);
    (**(code **)(*pos + 0x10))(pos);
    std::__ostream_insert<char,std::char_traits<char>>
              (*(ostream **)(pos[2] + (ulong)*(uint *)(pos + 1) * 8),
               "WLPFRD01 Warning: found empty exponent in LP file - check for forbidden variable names with initial \'e\' or \'E\'\n"
               ,0x6f);
    (**(code **)(*pos + 0x10))(pos,local_2038);
  }
  pbVar6 = *(byte **)this;
  if (bVar8) {
    pbVar7 = (byte *)local_2038;
    while (pbVar6 != pbVar10) {
      *pbVar7 = *pbVar6;
      pbVar7 = pbVar7 + 1;
      pbVar6 = pbVar6 + 1;
      *(byte **)this = pbVar6;
    }
    *pbVar7 = 0;
    dVar1 = atof((char *)local_2038);
    uVar11 = SUB84(dVar1,0);
    uVar12 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  else {
    uVar11 = (undefined4)*(undefined8 *)(&DAT_00601180 + (ulong)(*pbVar6 == 0x2d) * 8);
    uVar12 = (undefined4)
             ((ulong)*(undefined8 *)(&DAT_00601180 + (ulong)(*pbVar6 == 0x2d) * 8) >> 0x20);
  }
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)__return_storage_ptr__,(double)CONCAT44(uVar12,uVar11))
  ;
  *(byte **)this = pbVar10;
  if (((ulong)*pbVar10 < 0x21) && ((0x100002600U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0)) {
    *(byte **)this = pbVar10 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

static R LPFreadValue(char*& pos, SPxOut* spxout)
{
   assert(LPFisValue(pos));

   char        tmp[SOPLEX_LPF_MAX_LINE_LEN];
   const char* s = pos;
   char*       t;
   R        value = 1.0;
   bool        has_digits = false;
   bool        has_emptyexponent = false;

   // 1. sign
   if((*s == '+') || (*s == '-'))
      s++;

   // 2. Digits before the decimal dot
   while((*s >= '0') && (*s <= '9'))
   {
      has_digits = true;
      s++;
   }

   // 3. Decimal dot
   if(*s == '.')
   {
      s++;

      // 4. If there was a dot, possible digit behind it
      while((*s >= '0') && (*s <= '9'))
      {
         has_digits = true;
         s++;
      }
   }

   // 5. Exponent
   if(tolower(*s) == 'e')
   {
      has_emptyexponent = true;
      s++;

      // 6. Exponent sign
      if((*s == '+') || (*s == '-'))
         s++;

      // 7. Exponent digits
      while((*s >= '0') && (*s <= '9'))
      {
         has_emptyexponent = false;
         s++;
      }
   }

   assert(s != pos);

   if(has_emptyexponent)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "WLPFRD01 Warning: found empty exponent in LP file - check for forbidden variable names with initial 'e' or 'E'\n";
                     )
   }

   if(!has_digits)
      value = (*pos == '-') ? -1.0 : 1.0;
   else
   {
      for(t = tmp; pos != s; pos++)
         *t++ = *pos;

      *t = '\0';
      value = atof(tmp);
   }

   pos += s - pos;

   assert(pos == s);

   SPxOut::debug(spxout, "DLPFRD01 LPFreadValue = {}\n", value);

   if(LPFisSpace(*pos))
      pos++;

   return value;
}